

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlendMode.cpp
# Opt level: O0

bool sf::operator==(BlendMode *left,BlendMode *right)

{
  bool local_11;
  BlendMode *right_local;
  BlendMode *left_local;
  
  local_11 = false;
  if ((((left->colorSrcFactor == right->colorSrcFactor) &&
       (local_11 = false, left->colorDstFactor == right->colorDstFactor)) &&
      (local_11 = false, left->colorEquation == right->colorEquation)) &&
     ((local_11 = false, left->alphaSrcFactor == right->alphaSrcFactor &&
      (local_11 = false, left->alphaDstFactor == right->alphaDstFactor)))) {
    local_11 = left->alphaEquation == right->alphaEquation;
  }
  return local_11;
}

Assistant:

bool operator ==(const BlendMode& left, const BlendMode& right)
{
    return (left.colorSrcFactor == right.colorSrcFactor) &&
           (left.colorDstFactor == right.colorDstFactor) &&
           (left.colorEquation  == right.colorEquation)  &&
           (left.alphaSrcFactor == right.alphaSrcFactor) &&
           (left.alphaDstFactor == right.alphaDstFactor) &&
           (left.alphaEquation  == right.alphaEquation);
}